

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec-wrapper.h
# Opt level: O0

string * __thiscall
wasm::generateSpecWrapper_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Module *wasm)

{
  size_t *this_00;
  bool bVar1;
  BasicType BVar2;
  pointer pEVar3;
  Name *pNVar4;
  Type *this_01;
  Name NVar5;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar6;
  Type *param;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  char *local_58;
  char *pcStack_50;
  Function *local_48;
  Function *func;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  Module *wasm_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)this);
  exp = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
        std::
        vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ::end((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               *)this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                *)&exp);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    func = (Function *)
           __gnu_cxx::
           __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
           ::operator*(&__end1);
    pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                       ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)func);
    if (pEVar3->kind == Function) {
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)func);
      pNVar4 = Export::getInternalName(pEVar3);
      local_58 = (char *)(pNVar4->super_IString).str._M_len;
      pcStack_50 = (pNVar4->super_IString).str._M_str;
      NVar5.super_IString.str._M_str = local_58;
      NVar5.super_IString.str._M_len = (size_t)this;
      local_48 = (Function *)::wasm::Module::getFunctionOrNull(NVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"(invoke \"",&local_c9)
      ;
      pEVar3 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)func);
      IString::toString_abi_cxx11_((string *)&__range2,(IString *)pEVar3);
      std::operator+(&local_a8,&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2)
      ;
      std::operator+(&local_88,&local_a8,"\" ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&__range2);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)Function::getParams(local_48);
      this_00 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
      join_0x00000010_0x00000000_ =
           (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
           Type::begin((Type *)this_00);
      PVar6 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
              Type::end((Type *)this_00);
      while( true ) {
        __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)PVar6.index;
        param = PVar6.parent;
        bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                          ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                           &__end2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                  &param);
        if (!bVar1) break;
        this_01 = (Type *)::wasm::Type::Iterator::operator*
                                    ((Iterator *)
                                     &__end2.
                                      super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      .index);
        bVar1 = Type::isTuple(this_01);
        if (bVar1) {
          __assert_fail("!param.isTuple() && \"Unexpected tuple type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/spec-wrapper.h"
                        ,0x25,"std::string wasm::generateSpecWrapper(Module &)");
        }
        bVar1 = Type::isBasic(this_01);
        if (!bVar1) {
          __assert_fail("param.isBasic() && \"TODO: handle compound types\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/spec-wrapper.h"
                        ,0x25,"std::string wasm::generateSpecWrapper(Module &)");
        }
        BVar2 = Type::getBasic(this_01);
        switch(BVar2) {
        case none:
        case unreachable:
          ::wasm::handle_unreachable
                    ("unexpected type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/spec-wrapper.h"
                     ,0x38);
        case i32:
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(i32.const 0)");
          break;
        case i64:
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(i64.const 0)");
          break;
        case f32:
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(f32.const 0)");
          break;
        case f64:
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(f64.const 0)");
          break;
        case v128:
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,"(v128.const i32x4 0 0 0 0)");
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
        ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                  ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                   &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                  );
        PVar6.index = (size_t)__end2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent;
        PVar6.parent = param;
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,") ");
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

inline std::string generateSpecWrapper(Module& wasm) {
  std::string ret;
  for (auto& exp : wasm.exports) {
    if (exp->kind != ExternalKind::Function) {
      continue; // something exported other than a function
    }
    auto* func = wasm.getFunctionOrNull(*exp->getInternalName());
    ret += std::string("(invoke \"") + exp->name.toString() + "\" ";
    for (const auto& param : func->getParams()) {
      // zeros in arguments TODO more?
      TODO_SINGLE_COMPOUND(param);
      switch (param.getBasic()) {
        case Type::i32:
          ret += "(i32.const 0)";
          break;
        case Type::i64:
          ret += "(i64.const 0)";
          break;
        case Type::f32:
          ret += "(f32.const 0)";
          break;
        case Type::f64:
          ret += "(f64.const 0)";
          break;
        case Type::v128:
          ret += "(v128.const i32x4 0 0 0 0)";
          break;
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      ret += " ";
    }
    ret += ") ";
  }
  return ret;
}